

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

XVisualInfo *
sf::priv::GlxContext::selectBestVisual(Display *display,uint bitsPerPixel,ContextSettings *settings)

{
  int iVar1;
  ostream *poVar2;
  ContextSettings *in_RCX;
  uint in_EDX;
  Display *in_RSI;
  XVisualInfo *in_RDI;
  int score;
  int color;
  bool accelerated;
  int sRgb;
  int samples;
  int multiSampling;
  int stencil;
  int depth;
  int alpha;
  int blue;
  int green;
  int red;
  int doubleBuffer;
  int i;
  int bestScore;
  XVisualInfo *visuals;
  int count;
  int screen;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_98;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_20;
  int local_1c;
  ContextSettings *local_18;
  uint local_c;
  Display *local_8;
  
  local_18 = in_RCX;
  local_c = in_EDX;
  local_8 = in_RSI;
  anon_unknown.dwarf_27d252::ensureExtensionsInit
            ((Display *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
  local_1c = *(int *)(local_8 + 0xe0);
  local_28 = XGetVisualInfo(local_8,0,0,&local_20);
  if (local_28 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"No GLX visual found. You should check your graphics driver");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    memset(in_RDI,0,0x40);
  }
  else {
    local_2c = 0x7fffffff;
    memset(in_RDI,0,0x40);
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      if ((*(int *)(local_28 + (long)local_30 * 0x40 + 0x10) == local_1c) &&
         ((*sf_glad_glXGetConfig)
                    (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),5,&local_34),
         local_34 != 0)) {
        (*sf_glad_glXGetConfig)
                  (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),8,&local_38);
        (*sf_glad_glXGetConfig)
                  (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),9,&local_3c);
        (*sf_glad_glXGetConfig)
                  (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),10,&local_40);
        (*sf_glad_glXGetConfig)
                  (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),0xb,&local_44);
        (*sf_glad_glXGetConfig)
                  (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),0xc,&local_48);
        (*sf_glad_glXGetConfig)
                  (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),0xd,&local_4c);
        if (SF_GLAD_GLX_ARB_multisample == 0) {
          local_50 = 0;
          local_54 = 0;
        }
        else {
          (*sf_glad_glXGetConfig)
                    (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),100000,&local_50);
          (*sf_glad_glXGetConfig)
                    (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),0x186a1,&local_54);
        }
        if ((SF_GLAD_GLX_EXT_framebuffer_sRGB == 0) && (SF_GLAD_GLX_ARB_framebuffer_sRGB == 0)) {
          local_58 = 0;
        }
        else {
          (*sf_glad_glXGetConfig)
                    (local_8,(XVisualInfo *)(local_28 + (long)local_30 * 0x40),0x20b2,&local_58);
        }
        if (local_50 == 0) {
          local_98 = 0;
        }
        else {
          local_98 = local_54;
        }
        iVar1 = GlContext::evaluateFormat
                          (local_c,local_18,local_38 + local_3c + local_40 + local_44,local_48,
                           local_4c,local_98,true,local_58 == 1);
        if (iVar1 < local_2c) {
          local_2c = iVar1;
          memcpy(in_RDI,(void *)(local_28 + (long)local_30 * 0x40),0x40);
        }
      }
    }
    XFree(local_28);
  }
  return in_RDI;
}

Assistant:

XVisualInfo GlxContext::selectBestVisual(::Display* display, unsigned int bitsPerPixel, const ContextSettings& settings)
{
    // Make sure that extensions are initialized
    ensureExtensionsInit(display, DefaultScreen(display));

    const int screen = DefaultScreen(display);

    // Retrieve all the visuals
    int count;
    XVisualInfo* visuals = XGetVisualInfo(display, 0, NULL, &count);
    if (visuals)
    {
        // Evaluate all the returned visuals, and pick the best one
        int bestScore = 0x7FFFFFFF;
        XVisualInfo bestVisual = XVisualInfo();
        for (int i = 0; i < count; ++i)
        {
            // Filter by screen
            if (visuals[i].screen != screen)
                continue;

            // Check mandatory attributes
            int doubleBuffer;
            glXGetConfig(display, &visuals[i], GLX_DOUBLEBUFFER, &doubleBuffer);
            if (!doubleBuffer)
                continue;

            // Extract the components of the current visual
            int red, green, blue, alpha, depth, stencil, multiSampling, samples, sRgb;
            glXGetConfig(display, &visuals[i], GLX_RED_SIZE,     &red);
            glXGetConfig(display, &visuals[i], GLX_GREEN_SIZE,   &green);
            glXGetConfig(display, &visuals[i], GLX_BLUE_SIZE,    &blue);
            glXGetConfig(display, &visuals[i], GLX_ALPHA_SIZE,   &alpha);
            glXGetConfig(display, &visuals[i], GLX_DEPTH_SIZE,   &depth);
            glXGetConfig(display, &visuals[i], GLX_STENCIL_SIZE, &stencil);

            if (SF_GLAD_GLX_ARB_multisample)
            {
                glXGetConfig(display, &visuals[i], GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
                glXGetConfig(display, &visuals[i], GLX_SAMPLES_ARB,        &samples);
            }
            else
            {
                multiSampling = 0;
                samples = 0;
            }

            if (SF_GLAD_GLX_EXT_framebuffer_sRGB || SF_GLAD_GLX_ARB_framebuffer_sRGB)
            {
                glXGetConfig(display, &visuals[i], GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
            }
            else
            {
                sRgb = 0;
            }

            // TODO: Replace this with proper acceleration detection
            bool accelerated = true;

            // Evaluate the visual
            int color = red + green + blue + alpha;
            int score = evaluateFormat(bitsPerPixel, settings, color, depth, stencil, multiSampling ? samples : 0, accelerated, sRgb == True);

            // If it's better than the current best, make it the new best
            if (score < bestScore)
            {
                bestScore = score;
                bestVisual = visuals[i];
            }
        }

        // Free the array of visuals
        XFree(visuals);

        return bestVisual;
    }
    else
    {
        // Should never happen...
        err() << "No GLX visual found. You should check your graphics driver" << std::endl;

        return XVisualInfo();
    }
}